

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenerators::EndsWith(cmQtAutoGenerators *this,string *str,string *with)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *with_local;
  string *str_local;
  cmQtAutoGenerators *this_local;
  
  local_28 = with;
  with_local = str;
  str_local = &this->QtMajorVersion;
  uVar2 = std::__cxx11::string::length();
  uVar3 = std::__cxx11::string::length();
  psVar1 = with_local;
  if (uVar3 < uVar2) {
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_48,(ulong)psVar1);
    this_local._7_1_ = std::operator==(&local_48,local_28);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerators::EndsWith(const std::string& str,
                                  const std::string& with)
{
  if (with.length() > (str.length()))
    {
    return false;
    }
  return (str.substr(str.length() - with.length(), with.length()) == with);
}